

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.c
# Opt level: O0

BOOL is_member_of_set(unsigned_short n,List *set)

{
  TokenType TVar1;
  int iVar2;
  BOOL BVar3;
  char *pcVar4;
  uint local_234;
  char *pcStack_230;
  int mask;
  char *s;
  char buf [512];
  List *local_20;
  List *tmp;
  List *set_local;
  unsigned_short n_local;
  
  if ((set->token).type == TOK_QUOTED_STRING) {
    pcStack_230 = (set->token).u.string;
    for (local_234 = 0x8000; local_234 != 0; local_234 = (int)local_234 >> 1) {
      if (((*pcStack_230 == '0') && ((n & local_234) != 0)) ||
         ((*pcStack_230 == '1' && ((n & local_234) == 0)))) {
        return FALSE;
      }
      pcStack_230 = pcStack_230 + 1;
    }
    set_local._4_4_ = TRUE;
  }
  else if ((set->token).type == TOK_LIST) {
    if (set->car == (ListStruct *)0x0) {
      set_local._4_4_ = FALSE;
    }
    else {
      TVar1 = (set->car->token).type;
      if (TVar1 == TOK_NOT) {
        iVar2 = list_length(set->car);
        if (iVar2 == 2) {
          BVar3 = is_member_of_set(n,set->car->cdr);
          set_local._4_4_ = (BOOL)((BVar3 != FALSE ^ 0xffU) & 1);
        }
        else {
          parse_error(set->car,"Must have exactly one argument to not.\n");
          set_local._4_4_ = FALSE;
        }
      }
      else if (TVar1 == TOK_UNION) {
        iVar2 = list_length(set->car);
        if (iVar2 < 2) {
          parse_error(set->car,"Missing arguments to union.\n");
        }
        for (local_20 = set->car->cdr; local_20 != (List *)0x0; local_20 = local_20->cdr) {
          BVar3 = is_member_of_set(n,local_20);
          if (BVar3 != FALSE) {
            return TRUE;
          }
        }
        set_local._4_4_ = FALSE;
      }
      else if (TVar1 == TOK_INTERSECT) {
        iVar2 = list_length(set->car);
        if (iVar2 < 2) {
          parse_error(set->car,"Missing arguments to intersect.\n");
        }
        for (local_20 = set->car->cdr; local_20 != (List *)0x0; local_20 = local_20->cdr) {
          BVar3 = is_member_of_set(n,local_20);
          if (BVar3 == FALSE) {
            return FALSE;
          }
        }
        set_local._4_4_ = TRUE;
      }
      else {
        parse_error(set,
                    "Malformed bit set; expecting quoted string of bits, union, intersect, or not.\n"
                   );
        set_local._4_4_ = FALSE;
      }
    }
  }
  else {
    pcVar4 = unparse_token(&set->token,(char *)&s);
    parse_error(set,
                "Malformed bit set; expecting quoted string of bits, union, intersect, or not, found %s\n"
                ,pcVar4);
    set_local._4_4_ = FALSE;
  }
  return set_local._4_4_;
}

Assistant:

BOOL
is_member_of_set (unsigned short n, List *set)
{
  List *tmp;
  char buf[512];

  /* If we are looking for a match against a quoted string, efficiently
   * determine if all of the literal bits match.  This could be vastly
   * faster if the quoted string were replaced with a mask of bits that must
   * be valid and a set of values for those bits, but speed just doesn't
   * matter here, and it's handy to deal with the original string (which
   * can contain other information via the specific choice of non-'0'
   * and non-'1' characters).
   */
  if (set->token.type == TOK_QUOTED_STRING)
    {
      const char *s = set->token.u.string;
      int mask;


      for (mask = 1 << 15; mask != 0; s++, mask >>= 1)
	if ((*s == '0' && (n & mask)) || (*s == '1' && !(n & mask)))
	  {
	    return FALSE;
	  }

      return TRUE;
    }

  if (set->token.type != TOK_LIST)
    {
      /* This error will get printed a zillion times, but who cares. */
      parse_error (set, "Malformed bit set; expecting quoted string of bits, "
		   "union, intersect, or not, found %s\n",
		   unparse_token (&set->token, buf));
      return FALSE;
    }

  /* Not a member of the empty list. */
  if (set->car == NULL)
    return FALSE;

  /* See what type of operation we are performing, and do the appropriate
   * thing.
   */
  switch (set->car->token.type) {
  case TOK_UNION:
    if (list_length (set->car) < 2)
      parse_error (set->car, "Missing arguments to union.\n");
    for (tmp = CDAR (set); tmp != NULL; tmp = tmp->cdr)
      if (is_member_of_set (n, tmp))
	return TRUE;
    return FALSE;
  case TOK_INTERSECT:
    if (list_length (set->car) < 2)
      parse_error (set->car, "Missing arguments to intersect.\n");
    for (tmp = CDAR (set); tmp != NULL; tmp = tmp->cdr)
      if (!is_member_of_set (n, tmp))
	return FALSE;
    return TRUE;
  case TOK_NOT:
    if (list_length (set->car) != 2)
      {
	parse_error (set->car, "Must have exactly one argument to not.\n");
	return FALSE;
      }
    return !is_member_of_set (n, CDAR (set));
  default:
    /* This error will get printed a zillion times, but who cares. */
    parse_error (set, "Malformed bit set; expecting quoted string of bits, "
		 "union, intersect, or not.\n");
    return FALSE;
  }
}